

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_common.hpp
# Opt level: O3

void __thiscall chaiscript::exception::eval_error::eval_error(eval_error *this,string *t_why)

{
  pointer pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  size_type *local_58;
  size_type local_50;
  size_type local_48;
  undefined8 uStack_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::operator+(&local_38,"Error: \"",t_why);
  pbVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_38,"\" ");
  local_58 = (size_type *)(pbVar2->_M_dataplus)._M_p;
  paVar3 = &pbVar2->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58 == paVar3) {
    local_48 = paVar3->_M_allocated_capacity;
    uStack_40 = *(undefined8 *)((long)&pbVar2->field_2 + 8);
    local_58 = &local_48;
  }
  else {
    local_48 = paVar3->_M_allocated_capacity;
  }
  local_50 = pbVar2->_M_string_length;
  (pbVar2->_M_dataplus)._M_p = (pointer)paVar3;
  pbVar2->_M_string_length = 0;
  (pbVar2->field_2)._M_local_buf[0] = '\0';
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)&local_58);
  if (local_58 != &local_48) {
    operator_delete(local_58,local_48 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  *(undefined ***)this = &PTR__eval_error_00238fd8;
  (this->reason)._M_dataplus._M_p = (pointer)&(this->reason).field_2;
  pcVar1 = (t_why->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->reason,pcVar1,pcVar1 + t_why->_M_string_length);
  (this->start_position).line = 0;
  (this->start_position).column = 0;
  (this->filename)._M_dataplus._M_p = (pointer)&(this->filename).field_2;
  (this->filename)._M_string_length = 0;
  (this->filename).field_2._M_local_buf[0] = '\0';
  (this->detail)._M_dataplus._M_p = (pointer)&(this->detail).field_2;
  (this->detail)._M_string_length = 0;
  (this->detail).field_2._M_local_buf[0] = '\0';
  (this->call_stack).
  super__Vector_base<chaiscript::AST_Node_Trace,_std::allocator<chaiscript::AST_Node_Trace>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->call_stack).
  super__Vector_base<chaiscript::AST_Node_Trace,_std::allocator<chaiscript::AST_Node_Trace>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->call_stack).
  super__Vector_base<chaiscript::AST_Node_Trace,_std::allocator<chaiscript::AST_Node_Trace>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

explicit eval_error(const std::string &t_why) noexcept
          : std::runtime_error("Error: \"" + t_why + "\" ")
          , reason(t_why) {
      }